

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O0

int MPIABI_Type_create_hvector
              (int count,int blocklength,MPIABI_Aint stride,MPIABI_Datatype oldtype,
              MPIABI_Datatype *newtype)

{
  int iVar1;
  ompi_datatype_t *poVar2;
  ompi_datatype_t **ppoVar3;
  WPI_HandlePtr<ompi_datatype_t_*> local_38;
  WPI_Handle local_30 [8];
  MPIABI_Datatype *local_28;
  MPIABI_Datatype *newtype_local;
  MPIABI_Datatype oldtype_local;
  MPIABI_Aint stride_local;
  int blocklength_local;
  int count_local;
  
  local_28 = newtype;
  newtype_local = (MPIABI_Datatype *)oldtype;
  oldtype_local = stride;
  stride_local._0_4_ = blocklength;
  stride_local._4_4_ = count;
  WPI_Handle<ompi_datatype_t_*>::WPI_Handle((WPI_Handle<ompi_datatype_t_*> *)local_30,oldtype);
  poVar2 = WPI_Handle::operator_cast_to_ompi_datatype_t_(local_30);
  WPI_HandlePtr<ompi_datatype_t_*>::WPI_HandlePtr(&local_38,local_28);
  ppoVar3 = WPI_HandlePtr::operator_cast_to_ompi_datatype_t__((WPI_HandlePtr *)&local_38);
  iVar1 = MPI_Type_create_hvector(count,blocklength,stride,poVar2,ppoVar3);
  WPI_HandlePtr<ompi_datatype_t_*>::~WPI_HandlePtr(&local_38);
  return iVar1;
}

Assistant:

int MPIABI_Type_create_hvector(
  int count,
  int blocklength,
  MPIABI_Aint stride,
  MPIABI_Datatype oldtype,
  MPIABI_Datatype * newtype
) {
  return MPI_Type_create_hvector(
    count,
    blocklength,
    (MPI_Aint)(WPI_Aint)stride,
    (MPI_Datatype)(WPI_Datatype)oldtype,
    (MPI_Datatype *)(WPI_DatatypePtr)newtype
  );
}